

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

void __thiscall
argparse::Argument::Argument<2ul,0ul,1ul>
          (Argument *this,basic_string_view<char,_std::char_traits<char>_> *a,char *param_3)

{
  pointer pbVar1;
  pointer pbVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  char *extraout_RDX;
  Argument *pAVar7;
  string_view s;
  string_view s_00;
  
  (this->mNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mUsedName)._M_len = 0;
  (this->mNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mUsedName)._M_str = (char *)0x0;
  (this->mHelp)._M_dataplus._M_p = (pointer)&(this->mHelp).field_2;
  (this->mHelp)._M_string_length = 0;
  (this->mHelp).field_2._M_local_buf[0] = '\0';
  (this->mDefaultValue)._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  (this->mDefaultValue)._M_storage._M_ptr = (void *)0x0;
  (this->mImplicitValue)._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  (this->mImplicitValue)._M_storage._M_ptr = (void *)0x0;
  *(undefined8 *)
   &(this->mAction).
    super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    .
    super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    .
    super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
    ._M_u = 0;
  *(undefined8 *)
   ((long)&(this->mAction).
           super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           .
           super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
   + 8) = 0;
  *(code **)((long)&(this->mAction).
                    super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    .
                    super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
            + 0x18) =
       std::
       _Function_handler<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_argparse::Argument::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/include/argparse/argparse.hpp:743:7)>
       ::_M_invoke;
  *(code **)((long)&(this->mAction).
                    super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                    .
                    super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
                    .
                    super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
            + 0x10) =
       std::
       _Function_handler<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_argparse::Argument::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/include/argparse/argparse.hpp:743:7)>
       ::_M_manager;
  *(__index_type *)
   ((long)&(this->mAction).
           super__Variant_base<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
           .
           super__Move_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_assign_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Move_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Copy_ctor_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
           .
           super__Variant_storage_alias<std::function<std::any_(const_std::__cxx11::basic_string<char>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char>_&)>_>
   + 0x20) = '\0';
  (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mValues).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mNumArgs = 1;
  if (((a->_M_len != 0) && (*a->_M_str == '-')) &&
     (pAVar7 = (Argument *)(a->_M_len - 1), pAVar7 != (Argument *)0x0)) {
    s._M_len = a->_M_str + 1;
    s._M_str = param_3;
    bVar4 = is_decimal_literal(pAVar7,s);
    bVar5 = true;
    param_3 = extraout_RDX;
    if (!bVar4) goto LAB_0011b3b8;
  }
  if (((a[1]._M_len == 0) || (*a[1]._M_str != '-')) ||
     (pAVar7 = (Argument *)(a[1]._M_len - 1), pAVar7 == (Argument *)0x0)) {
    bVar5 = false;
  }
  else {
    s_00._M_len = a[1]._M_str + 1;
    s_00._M_str = param_3;
    bVar5 = is_decimal_literal(pAVar7,s_00);
    bVar5 = !bVar5;
  }
LAB_0011b3b8:
  this->field_0xac = this->field_0xac & 0xf8 | bVar5;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,a);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,a + 1);
  pbVar1 = (this->mNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->mNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar1 != pbVar2) {
    uVar6 = (long)pbVar2 - (long)pbVar1 >> 5;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<argparse::Argument::Argument<2ul,0ul,1ul>(std::basic_string_view<char,std::char_traits<char>>(&&)[2ul],std::integer_sequence<unsigned_long,0ul,1ul>)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (pbVar1,pbVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<argparse::Argument::Argument<2ul,0ul,1ul>(std::basic_string_view<char,std::char_traits<char>>(&&)[2ul],std::integer_sequence<unsigned_long,0ul,1ul>)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (pbVar1,pbVar2);
  }
  return;
}

Assistant:

explicit Argument(std::string_view(&&a)[N], std::index_sequence<I...>)
      : mIsOptional((is_optional(a[I]) || ...)), mIsRequired(false),
        mIsUsed(false) {
    ((void)mNames.emplace_back(a[I]), ...);
    std::sort(
        mNames.begin(), mNames.end(), [](const auto &lhs, const auto &rhs) {
          return lhs.size() == rhs.size() ? lhs < rhs : lhs.size() < rhs.size();
        });
  }